

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O1

void __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::EmitCodeBlock
          (LuaBfbsGenerator *this,string *code_block,string *name,string *ns,string *declaring_file)

{
  _Rb_tree_header *p_Var1;
  size_type sVar2;
  pointer pcVar3;
  string *psVar4;
  Schema *pSVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  undefined8 *puVar8;
  ushort uVar9;
  ulong uVar10;
  size_type *psVar11;
  long *plVar12;
  ulong *puVar13;
  char *pcVar14;
  undefined8 uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  string path;
  string file_name;
  string code;
  string full_qualified_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string root_file;
  string root_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  LuaBfbsGenerator *local_130;
  long *local_128;
  size_t local_120;
  long local_118;
  long lStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string *local_48;
  string *local_40;
  string *local_38;
  
  pSVar5 = (this->super_BaseBfbsGenerator).schema_;
  if (*(ushort *)(pSVar5 + -(long)*(int *)pSVar5) < 0xd) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(ushort *)(pSVar5 + (0xc - (long)*(int *)pSVar5));
  }
  if (uVar9 == 0) {
    pSVar5 = (Schema *)0x0;
  }
  else {
    pSVar5 = pSVar5 + (ulong)*(uint *)(pSVar5 + uVar9) + (ulong)uVar9;
  }
  if (*(ushort *)(pSVar5 + -(long)*(int *)pSVar5) < 5) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(ushort *)(pSVar5 + (4 - (long)*(int *)pSVar5));
  }
  uVar10 = (ulong)uVar9;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_130 = this;
  local_38 = code_block;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,pSVar5 + *(uint *)(pSVar5 + uVar10) + uVar10 + 4,
             pSVar5 + (ulong)*(uint *)(pSVar5 + *(uint *)(pSVar5 + uVar10) + uVar10) +
                      *(uint *)(pSVar5 + uVar10) + uVar10 + 4);
  pSVar5 = (local_130->super_BaseBfbsGenerator).schema_;
  if (*(ushort *)(pSVar5 + -(long)*(int *)pSVar5) < 0xd) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(ushort *)(pSVar5 + (0xc - (long)*(int *)pSVar5));
  }
  if (uVar9 == 0) {
    pSVar5 = (Schema *)0x0;
  }
  else {
    pSVar5 = pSVar5 + (ulong)*(uint *)(pSVar5 + uVar9) + (ulong)uVar9;
  }
  if (*(ushort *)(pSVar5 + -(long)*(int *)pSVar5) < 0x13) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(ushort *)(pSVar5 + (0x12 - (long)*(int *)pSVar5));
  }
  uVar10 = (ulong)uVar9;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,pSVar5 + *(uint *)(pSVar5 + uVar10) + uVar10 + 4,
             pSVar5 + (ulong)*(uint *)(pSVar5 + *(uint *)(pSVar5 + uVar10) + uVar10) +
                      *(uint *)(pSVar5 + uVar10) + uVar10 + 4);
  sVar2 = ns->_M_string_length;
  local_40 = ns;
  if (sVar2 == 0) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    pcVar3 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar3,pcVar3 + name->_M_string_length);
  }
  else {
    local_a8[0] = local_98;
    pcVar3 = (ns->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_a8,pcVar3,pcVar3 + sVar2);
    std::__cxx11::string::append((char *)local_a8);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_a8,(ulong)(name->_M_dataplus)._M_p);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_e8.field_2._M_allocated_capacity = *psVar11;
      local_e8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar11;
      local_e8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_e8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
  }
  if ((sVar2 != 0) && (local_a8[0] != local_98)) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  std::operator+(&local_190,"--[[ ",&local_e8);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_190);
  local_128 = &local_118;
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_118 = *plVar12;
    lStack_110 = plVar6[3];
  }
  else {
    local_118 = *plVar12;
    local_128 = (long *)*plVar6;
  }
  local_120 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  paVar16 = &local_190.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar16) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_128);
  std::__cxx11::string::append((char *)&local_128);
  std::__cxx11::string::append((char *)&local_128);
  std::operator+(&local_170,"  flatc version: ",&local_130->flatc_version_);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_190.field_2._M_allocated_capacity = *psVar11;
    local_190.field_2._8_8_ = plVar6[3];
    local_190._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar11;
    local_190._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_190._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_190._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar16) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_128);
  std::operator+(&local_170,"  Declared by  : ",declaring_file);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_190.field_2._M_allocated_capacity = *psVar11;
    local_190.field_2._8_8_ = plVar6[3];
    local_190._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar11;
    local_190._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_190._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_190._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar16) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_108,"  Rooting type : ",&local_68);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_140 = *puVar13;
    lStack_138 = plVar6[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar13;
    local_150 = (ulong *)*plVar6;
  }
  local_148 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_88[0]);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170.field_2._8_8_ = plVar6[3];
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_170._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_190.field_2._M_allocated_capacity = *psVar11;
    local_190.field_2._8_8_ = plVar6[3];
    local_190._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar11;
    local_190._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_190._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_190._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar16) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_128);
  if ((local_130->requires_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var7 = (local_130->requires_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(local_130->requires_)._M_t._M_impl.super__Rb_tree_header;
    local_48 = name;
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      do {
        std::operator+(&local_108,"local ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var7 + 1));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_150 = &local_140;
        puVar13 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar13) {
          local_140 = *puVar13;
          lStack_138 = plVar6[3];
        }
        else {
          local_140 = *puVar13;
          local_150 = (ulong *)*plVar6;
        }
        local_148 = plVar6[1];
        *plVar6 = (long)puVar13;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_150,*(ulong *)(p_Var7 + 2));
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_170.field_2._M_allocated_capacity = *psVar11;
          local_170.field_2._8_8_ = plVar6[3];
        }
        else {
          local_170.field_2._M_allocated_capacity = *psVar11;
          local_170._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_170._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_190.field_2._M_allocated_capacity = *psVar11;
          local_190.field_2._8_8_ = plVar6[3];
        }
        else {
          local_190.field_2._M_allocated_capacity = *psVar11;
          local_190._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_190._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_190._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    }
    std::__cxx11::string::append((char *)&local_128);
    name = local_48;
  }
  paVar16 = &local_190.field_2;
  std::__cxx11::string::_M_append((char *)&local_128,(ulong)(local_38->_M_dataplus)._M_p);
  std::operator+(&local_190,"return ",name);
  std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_190._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar16) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  psVar4 = local_40;
  pcVar3 = (local_40->_M_dataplus)._M_p;
  local_190._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar3,pcVar3 + local_40->_M_string_length);
  if (psVar4->_M_string_length == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_190,0,(char *)local_190._M_string_length,0x38563c);
  }
  else if ((char *)local_190._M_string_length != (char *)0x0) {
    pcVar14 = (char *)0x0;
    do {
      if (local_190._M_dataplus._M_p[(long)pcVar14] == '.') {
        local_190._M_dataplus._M_p[(long)pcVar14] = '/';
      }
      pcVar14 = pcVar14 + 1;
    } while ((char *)local_190._M_string_length != pcVar14);
  }
  EnsureDirExists(&local_190);
  std::operator+(&local_108,&(local_130->options_).output_path,&local_190);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_140 = *puVar13;
    lStack_138 = plVar6[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar13;
    local_150 = (ulong *)*plVar6;
  }
  local_148 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  Namer::File(&local_c8,&(local_130->namer_).super_Namer,name,None);
  uVar10 = 0xf;
  if (local_150 != &local_140) {
    uVar10 = local_140;
  }
  if (uVar10 < local_c8._M_string_length + local_148) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      uVar15 = local_c8.field_2._M_allocated_capacity;
    }
    if (local_c8._M_string_length + local_148 <= (ulong)uVar15) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_150);
      goto LAB_00327002;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_c8._M_dataplus._M_p);
LAB_00327002:
  psVar11 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170.field_2._8_8_ = puVar8[3];
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_170._M_string_length = puVar8[1];
  *puVar8 = psVar11;
  puVar8[1] = 0;
  *(undefined1 *)psVar11 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  SaveFile(local_170._M_dataplus._M_p,(char *)local_128,local_120,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar16) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void EmitCodeBlock(const std::string &code_block, const std::string &name,
                     const std::string &ns,
                     const std::string &declaring_file) const {
    const std::string root_type = schema_->root_table()->name()->str();
    const std::string root_file =
        schema_->root_table()->declaration_file()->str();
    const std::string full_qualified_name = ns.empty() ? name : ns + "." + name;

    std::string code = "--[[ " + full_qualified_name + "\n\n";
    code +=
        "  Automatically generated by the FlatBuffers compiler, do not "
        "modify.\n";
    code += "  Or modify. I'm a message, not a cop.\n";
    code += "\n";
    code += "  flatc version: " + flatc_version_ + "\n";
    code += "\n";
    code += "  Declared by  : " + declaring_file + "\n";
    code += "  Rooting type : " + root_type + " (" + root_file + ")\n";
    code += "\n--]]\n\n";

    if (!requires_.empty()) {
      for (auto it = requires_.cbegin(); it != requires_.cend(); ++it) {
        code += "local " + it->first + " = require('" + it->second + "')\n";
      }
      code += "\n";
    }

    code += code_block;
    code += "return " + name;

    // Namespaces are '.' deliminted, so replace it with the path separator.
    std::string path = ns;

    if (ns.empty()) {
      path = ".";
    } else {
      std::replace(path.begin(), path.end(), '.', '/');
    }

    // TODO(derekbailey): figure out a save file without depending on util.h
    EnsureDirExists(path);
    const std::string file_name =
        options_.output_path + path + "/" + namer_.File(name);
    SaveFile(file_name.c_str(), code, false);
  }